

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_buf.c
# Opt level: O0

ngx_chain_t * ngx_chain_get_free_buf(ngx_pool_t *p,ngx_chain_t **free)

{
  ngx_buf_t *pnVar1;
  ngx_chain_t *cl;
  ngx_chain_t **free_local;
  ngx_pool_t *p_local;
  
  if (*free == (ngx_chain_t *)0x0) {
    p_local = (ngx_pool_t *)ngx_alloc_chain_link(p);
    if (p_local == (ngx_pool_t *)0x0) {
      p_local = (ngx_pool_t *)0x0;
    }
    else {
      pnVar1 = (ngx_buf_t *)ngx_pcalloc(p,0x50);
      (p_local->d).last = (u_char *)pnVar1;
      if ((ngx_buf_t *)(p_local->d).last == (ngx_buf_t *)0x0) {
        p_local = (ngx_pool_t *)0x0;
      }
      else {
        (p_local->d).end = (u_char *)0x0;
      }
    }
  }
  else {
    p_local = (ngx_pool_t *)*free;
    *free = (ngx_chain_t *)(p_local->d).end;
    (p_local->d).end = (u_char *)0x0;
  }
  return (ngx_chain_t *)p_local;
}

Assistant:

ngx_chain_t *
ngx_chain_get_free_buf(ngx_pool_t *p, ngx_chain_t **free)
{
    ngx_chain_t  *cl;

    if (*free) {
        cl = *free;
        *free = cl->next;
        cl->next = NULL;
        return cl;
    }

    cl = ngx_alloc_chain_link(p);
    if (cl == NULL) {
        return NULL;
    }

    cl->buf = ngx_calloc_buf(p);
    if (cl->buf == NULL) {
        return NULL;
    }

    cl->next = NULL;

    return cl;
}